

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

void ev3dev::sound::speak(string *text,bool bSynchronous)

{
  ostream *poVar1;
  ostringstream cmd;
  char *local_1b0;
  char local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"/usr/bin/espeak -a 200 --stdout \"",0x21);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," | /usr/bin/aplay -q",0x14);
  if (!bSynchronous) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," &",2);
  }
  std::__cxx11::stringbuf::str();
  system(local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void sound::speak(const std::string &text, bool bSynchronous) {
    std::ostringstream cmd;

    cmd << "/usr/bin/espeak -a 200 --stdout \"" << text << "\""
        << " | /usr/bin/aplay -q";

    if (!bSynchronous) cmd << " &";

    std::system(cmd.str().c_str());
}